

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

Error __thiscall llvm::sys::fs::TempFile::keep(TempFile *this,Twine *Name)

{
  Child *Str;
  int iVar1;
  int *piVar2;
  Twine *in_RDX;
  error_category *extraout_RDX;
  error_category *peVar3;
  error_category *extraout_RDX_00;
  int iVar4;
  error_code eVar5;
  StringRef Filename;
  Twine TStack_48;
  
  if ((Name->LHS).character == '\x01') {
    __assert_fail("!Done",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Path.cpp"
                  ,0x47a,"Error llvm::sys::fs::TempFile::keep(const Twine &)");
  }
  (Name->LHS).character = '\x01';
  Str = &Name->RHS;
  Twine::Twine(&TStack_48,(string *)Str);
  iVar1 = rename((char *)&TStack_48,(char *)in_RDX);
  iVar4 = 0;
  peVar3 = extraout_RDX;
  if (iVar1 != 0) {
    Twine::Twine(&TStack_48,(string *)Str);
    eVar5 = copy_file(&TStack_48,in_RDX);
    peVar3 = eVar5._M_cat;
    iVar4 = 0;
    if (eVar5._M_value != 0) {
      Twine::Twine(&TStack_48,(string *)Str);
      remove((fs *)&TStack_48,(char *)0x1);
      peVar3 = extraout_RDX_00;
      iVar4 = eVar5._M_value;
    }
  }
  Filename.Length = (size_t)peVar3;
  Filename.Data = *(char **)&Name->LHSKind;
  DontRemoveFileOnSignal((sys *)(Name->RHS).twine,Filename);
  if (iVar4 == 0) {
    std::__cxx11::string::_M_replace((ulong)Str,0,*(char **)&Name->LHSKind,0x1bb146);
  }
  iVar1._0_1_ = Name[1].LHSKind;
  iVar1._1_1_ = Name[1].RHSKind;
  iVar1._2_2_ = *(undefined2 *)&Name[1].field_0x12;
  iVar1 = close(iVar1);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    iVar4 = *piVar2;
    std::_V2::generic_category();
  }
  else {
    Name[1].LHSKind = ~NullKind;
    Name[1].RHSKind = ~NullKind;
    *(undefined2 *)&Name[1].field_0x12 = 0xffff;
  }
  eVar5._M_cat._0_4_ = iVar4;
  eVar5._0_8_ = this;
  eVar5._M_cat._4_4_ = 0;
  errorCodeToError(eVar5);
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error TempFile::keep(const Twine &Name) {
  assert(!Done);
  Done = true;
  // Always try to close and rename.
#ifdef _WIN32
  // If we can't cancel the delete don't rename.
  auto H = reinterpret_cast<HANDLE>(_get_osfhandle(FD));
  std::error_code RenameEC = setDeleteDisposition(H, false);
  if (!RenameEC)
    RenameEC = rename_fd(FD, Name);
  // If we can't rename, discard the temporary file.
  if (RenameEC)
    setDeleteDisposition(H, true);
#else
  std::error_code RenameEC = fs::rename(TmpName, Name);
  if (RenameEC) {
    // If we can't rename, try to copy to work around cross-device link issues.
    RenameEC = sys::fs::copy_file(TmpName, Name);
    // If we can't rename or copy, discard the temporary file.
    if (RenameEC)
      remove(TmpName);
  }
  sys::DontRemoveFileOnSignal(TmpName);
#endif

  if (!RenameEC)
    TmpName = "";

  if (close(FD) == -1) {
    std::error_code EC(errno, std::generic_category());
    return errorCodeToError(EC);
  }
  FD = -1;

  return errorCodeToError(RenameEC);
}